

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

bool __thiscall
cmsys::CommandLineArguments::GetMatchedArguments
          (CommandLineArguments *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *matches,string *arg)

{
  bool bVar1;
  __type _Var2;
  pointer __x;
  pointer ppVar3;
  long lVar4;
  CommandLineArgumentsCallbackStructure *cs;
  String *parg;
  _Base_ptr local_30;
  _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
  local_28;
  iterator it;
  string *arg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *matches_local;
  CommandLineArguments *this_local;
  
  it._M_node = (_Base_ptr)arg;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(matches);
  std::
  _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>::
  _Rb_tree_iterator(&local_28);
  local_30 = (_Base_ptr)
             std::
             map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
             ::begin(&(this->Internals->Callbacks).
                      super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                    );
  local_28._M_node = local_30;
  while( true ) {
    parg = (String *)
           std::
           map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
           ::end(&(this->Internals->Callbacks).
                  super_map<cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure,_std::less<cmsys::String>,_std::allocator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>_>
                );
    bVar1 = std::operator!=(&local_28,(_Self *)&parg);
    if (!bVar1) break;
    __x = std::
          _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
          ::operator->(&local_28);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
             ::operator->(&local_28);
    if (((ppVar3->second).ArgumentType == 0) || ((ppVar3->second).ArgumentType == 2)) {
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              it._M_node,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __x);
      if (_Var2) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(matches,(value_type *)__x);
      }
    }
    else {
      lVar4 = std::__cxx11::string::find((string *)it._M_node,(ulong)__x);
      if (lVar4 == 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(matches,(value_type *)__x);
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_cmsys::String,_cmsys::CommandLineArgumentsCallbackStructure>_>
    ::operator++(&local_28,0);
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(matches);
  return (bool)((bVar1 ^ 0xffU) & 1);
}

Assistant:

bool CommandLineArguments::GetMatchedArguments(
  std::vector<std::string>* matches,
  const std::string& arg)
{
  matches->clear();
  CommandLineArguments::Internal::CallbacksMap::iterator it;

  // Does the argument match to any we know about?
  for ( it = this->Internals->Callbacks.begin();
    it != this->Internals->Callbacks.end();
    it ++ )
    {
    const CommandLineArguments::Internal::String& parg = it->first;
    CommandLineArgumentsCallbackStructure *cs = &it->second;
    if (cs->ArgumentType == CommandLineArguments::NO_ARGUMENT ||
      cs->ArgumentType == CommandLineArguments::SPACE_ARGUMENT) 
      {
      if ( arg == parg )
        {
        matches->push_back(parg);
        }
      }
    else if ( arg.find( parg ) == 0 )
      {
      matches->push_back(parg);
      }
    }
  return !matches->empty();
}